

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *arkode_mem,N_Vector tmp1,
              N_Vector tmp2,N_Vector tmp3)

{
  int iVar1;
  ARKRhsFn p_Var2;
  long in_RDX;
  int retval;
  ARKRhsFn fi;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKRhsFn in_stack_00000090;
  ARKLsMem in_stack_00000098;
  ARKodeMem in_stack_000000a0;
  SUNMatrix in_stack_000000a8;
  N_Vector in_stack_000000b0;
  N_Vector in_stack_000000b8;
  sunrealtype in_stack_000000c0;
  N_Vector in_stack_000000d0;
  N_Vector in_stack_000000d8;
  ARKLsMem *in_stack_ffffffffffffff90;
  ARKodeMem *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  void *in_stack_ffffffffffffffa8;
  ARKodeMem local_48;
  int local_4;
  
  local_4 = arkLs_AccessARKODELMem
                      (in_stack_ffffffffffffffa8,
                       (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if (local_4 == 0) {
    if (in_RDX == 0) {
      arkProcessError(local_48,-2,0xa15,"arkLsDQJac",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"SUNMatrix is NULL");
      local_4 = -2;
    }
    else {
      p_Var2 = (*local_48->step_getimplicitrhs)(local_48);
      if (p_Var2 == (ARKRhsFn)0x0) {
        arkProcessError(local_48,-3,0xa1e,"arkLsDQJac",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"Time step module is missing implicit RHS fcn");
        local_4 = -3;
      }
      else if ((((local_48->tempv1->ops->nvcloneempty == (_func_N_Vector_N_Vector *)0x0) ||
                (local_48->tempv1->ops->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0))
               || (local_48->tempv1->ops->nvlinearsum ==
                   (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0)) ||
              (((local_48->tempv1->ops->nvdestroy == (_func_void_N_Vector *)0x0 ||
                (local_48->tempv1->ops->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0))
               || ((local_48->tempv1->ops->nvgetarraypointer ==
                    (_func_sunrealtype_ptr_N_Vector *)0x0 ||
                   (local_48->tempv1->ops->nvsetarraypointer ==
                    (_func_void_sunrealtype_ptr_N_Vector *)0x0)))))) {
        arkProcessError(local_48,-3,0xa2c,"arkLsDQJac",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"A required vector operation is not implemented.");
        local_4 = -3;
      }
      else {
        iVar1 = SUNMatGetID(in_RDX);
        if (iVar1 == 0) {
          local_4 = arkLsDenseDQJac((sunrealtype)Jac,(N_Vector)arkode_mem,tmp1,(SUNMatrix)tmp2,
                                    ark_mem,arkls_mem,fi,y);
        }
        else {
          iVar1 = SUNMatGetID(in_RDX);
          if (iVar1 == 3) {
            local_4 = arkLsBandDQJac(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                                     in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                                     in_stack_00000090,in_stack_000000d0,in_stack_000000d8);
          }
          else {
            arkProcessError(local_48,-3,0xa3c,"arkLsDQJac",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                            ,"arkLsDQJac not implemented for this SUNMatrix type!");
            local_4 = -3;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int arkLsDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
               void* arkode_mem, N_Vector tmp1, N_Vector tmp2,
               SUNDIALS_MAYBE_UNUSED N_Vector tmp3)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKRhsFn fi;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* verify that Jac is non-NULL */
  if (Jac == NULL)
  {
    arkProcessError(ark_mem, ARKLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    "SUNMatrix is NULL");
    return (ARKLS_LMEM_NULL);
  }

  /* Access implicit RHS function */
  fi = ark_mem->step_getimplicitrhs((void*)ark_mem);
  if (fi == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Time step module is missing implicit RHS fcn");
    return (ARKLS_ILL_INPUT);
  }

  /* Verify that N_Vector supports required routines */
  if (ark_mem->tempv1->ops->nvcloneempty == NULL ||
      ark_mem->tempv1->ops->nvwrmsnorm == NULL ||
      ark_mem->tempv1->ops->nvlinearsum == NULL ||
      ark_mem->tempv1->ops->nvdestroy == NULL ||
      ark_mem->tempv1->ops->nvscale == NULL ||
      ark_mem->tempv1->ops->nvgetarraypointer == NULL ||
      ark_mem->tempv1->ops->nvsetarraypointer == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (ARKLS_ILL_INPUT);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE)
  {
    retval = arkLsDenseDQJac(t, y, fy, Jac, ark_mem, arkls_mem, fi, tmp1);
  }
  else if (SUNMatGetID(Jac) == SUNMATRIX_BAND)
  {
    retval = arkLsBandDQJac(t, y, fy, Jac, ark_mem, arkls_mem, fi, tmp1, tmp2);
  }
  else
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "arkLsDQJac not implemented for this SUNMatrix type!");
    retval = ARKLS_ILL_INPUT;
  }
  return (retval);
}